

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# aggregate_executor.hpp
# Opt level: O3

void duckdb::AggregateExecutor::
     UnaryUpdate<duckdb::ReservoirQuantileState<long>,long,duckdb::ReservoirQuantileScalarOperation>
               (Vector *input,AggregateInputData *aggr_input_data,data_ptr_t state,idx_t count)

{
  long lVar1;
  long *input_00;
  data_ptr_t pdVar2;
  ulong uVar3;
  sel_t *psVar4;
  unsigned_long *puVar5;
  unsigned_long *puVar6;
  unsigned_long *puVar7;
  unsigned_long *puVar8;
  unsigned_long *puVar9;
  unsigned_long *puVar10;
  unsigned_long *puVar11;
  ulong uVar12;
  unsigned_long *puVar13;
  AggregateUnaryInput input_data;
  UnifiedVectorFormat local_98;
  ValidityMask *local_50;
  AggregateUnaryInput local_48;
  
  if (input->vector_type == FLAT_VECTOR) {
    pdVar2 = input->data;
    FlatVector::VerifyFlatVector(input);
    local_98.data = (data_ptr_t)&input->validity;
    local_98.validity.super_TemplatedValidityMask<unsigned_long>.validity_mask =
         (unsigned_long *)0x0;
    if (0x3f < count + 0x3f) {
      puVar10 = (unsigned_long *)0x0;
      uVar12 = 0;
      puVar11 = (unsigned_long *)0x0;
      local_98.sel = (SelectionVector *)aggr_input_data;
      local_50 = (ValidityMask *)local_98.data;
      do {
        puVar13 = (local_50->super_TemplatedValidityMask<unsigned_long>).validity_mask;
        if (puVar13 == (unsigned_long *)0x0) {
          puVar13 = puVar11 + 8;
          if (count <= puVar11 + 8) {
            puVar13 = (unsigned_long *)count;
          }
joined_r0x01a488dc:
          while (puVar9 = puVar10, puVar6 = puVar10,
                puVar7 = local_98.validity.super_TemplatedValidityMask<unsigned_long>.validity_mask,
                puVar10 < puVar13) {
            ReservoirQuantileOperation::
            Operation<long,duckdb::ReservoirQuantileState<long>,duckdb::ReservoirQuantileScalarOperation>
                      ((ReservoirQuantileState<long> *)state,(long *)(pdVar2 + (long)puVar10 * 8),
                       (AggregateUnaryInput *)&local_98);
            puVar10 = (unsigned_long *)
                      ((long)local_98.validity.super_TemplatedValidityMask<unsigned_long>.
                             validity_mask + 1);
            local_98.validity.super_TemplatedValidityMask<unsigned_long>.validity_mask = puVar10;
          }
        }
        else {
          uVar3 = puVar13[uVar12];
          puVar13 = puVar11 + 8;
          if (count <= puVar11 + 8) {
            puVar13 = (unsigned_long *)count;
          }
          if (uVar3 == 0xffffffffffffffff) goto joined_r0x01a488dc;
          puVar9 = puVar13;
          puVar6 = puVar13;
          puVar7 = puVar13;
          puVar8 = puVar11;
          puVar5 = local_98.validity.super_TemplatedValidityMask<unsigned_long>.validity_mask;
          if (uVar3 != 0) {
            while (local_98.validity.super_TemplatedValidityMask<unsigned_long>.validity_mask =
                        puVar8,
                  puVar9 = local_98.validity.super_TemplatedValidityMask<unsigned_long>.
                           validity_mask, puVar6 = puVar10, puVar7 = puVar5,
                  local_98.validity.super_TemplatedValidityMask<unsigned_long>.validity_mask <
                  puVar13) {
              if ((uVar3 >> ((ulong)(uint)((int)local_98.validity.
                                                super_TemplatedValidityMask<unsigned_long>.
                                                validity_mask - (int)puVar11) & 0x3f) & 1) != 0) {
                lVar1 = (long)local_98.validity.super_TemplatedValidityMask<unsigned_long>.
                              validity_mask * 8;
                local_98.validity.super_TemplatedValidityMask<unsigned_long>.validity_mask = puVar5;
                ReservoirQuantileOperation::
                Operation<long,duckdb::ReservoirQuantileState<long>,duckdb::ReservoirQuantileScalarOperation>
                          ((ReservoirQuantileState<long> *)state,(long *)(pdVar2 + lVar1),
                           (AggregateUnaryInput *)&local_98);
              }
              puVar10 = (unsigned_long *)
                        ((long)local_98.validity.super_TemplatedValidityMask<unsigned_long>.
                               validity_mask + 1);
              puVar5 = puVar10;
              puVar8 = puVar10;
            }
          }
        }
        local_98.validity.super_TemplatedValidityMask<unsigned_long>.validity_mask = puVar7;
        puVar10 = puVar6;
        uVar12 = uVar12 + 1;
        puVar11 = puVar9;
      } while (uVar12 != count + 0x3f >> 6);
    }
  }
  else if (input->vector_type == CONSTANT_VECTOR) {
    puVar10 = (input->validity).super_TemplatedValidityMask<unsigned_long>.validity_mask;
    if ((puVar10 == (unsigned_long *)0x0) || ((*puVar10 & 1) != 0)) {
      input_00 = (long *)input->data;
      local_98.data = (data_ptr_t)&input->validity;
      local_98.validity.super_TemplatedValidityMask<unsigned_long>.validity_mask =
           (unsigned_long *)0x0;
      if (count != 0) {
        local_98.sel = (SelectionVector *)aggr_input_data;
        do {
          ReservoirQuantileOperation::
          Operation<long,duckdb::ReservoirQuantileState<long>,duckdb::ReservoirQuantileScalarOperation>
                    ((ReservoirQuantileState<long> *)state,input_00,(AggregateUnaryInput *)&local_98
                    );
          count = count - 1;
        } while (count != 0);
      }
    }
  }
  else {
    UnifiedVectorFormat::UnifiedVectorFormat(&local_98);
    Vector::ToUnifiedFormat(input,count,&local_98);
    local_48.input_mask = &local_98.validity;
    local_48.input = aggr_input_data;
    if (local_98.validity.super_TemplatedValidityMask<unsigned_long>.validity_mask ==
        (unsigned_long *)0x0) {
      if (count != 0) {
        psVar4 = (local_98.sel)->sel_vector;
        uVar12 = 0;
        do {
          local_48.input_idx = uVar12;
          if (psVar4 != (sel_t *)0x0) {
            local_48.input_idx = (idx_t)psVar4[uVar12];
          }
          ReservoirQuantileOperation::
          Operation<long,duckdb::ReservoirQuantileState<long>,duckdb::ReservoirQuantileScalarOperation>
                    ((ReservoirQuantileState<long> *)state,
                     (long *)(local_98.data + local_48.input_idx * 8),&local_48);
          uVar12 = uVar12 + 1;
        } while (count != uVar12);
      }
    }
    else if (count != 0) {
      psVar4 = (local_98.sel)->sel_vector;
      uVar12 = 0;
      do {
        local_48.input_idx = uVar12;
        if (psVar4 != (sel_t *)0x0) {
          local_48.input_idx = (idx_t)psVar4[uVar12];
        }
        if ((local_98.validity.super_TemplatedValidityMask<unsigned_long>.validity_mask ==
             (unsigned_long *)0x0) ||
           ((local_98.validity.super_TemplatedValidityMask<unsigned_long>.validity_mask
             [local_48.input_idx >> 6] >> (local_48.input_idx & 0x3f) & 1) != 0)) {
          ReservoirQuantileOperation::
          Operation<long,duckdb::ReservoirQuantileState<long>,duckdb::ReservoirQuantileScalarOperation>
                    ((ReservoirQuantileState<long> *)state,
                     (long *)(local_98.data + local_48.input_idx * 8),&local_48);
        }
        uVar12 = uVar12 + 1;
      } while (count != uVar12);
    }
    if (local_98.owned_sel.selection_data.internal.
        super___shared_ptr<duckdb::SelectionData,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi !=
        (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                (local_98.owned_sel.selection_data.internal.
                 super___shared_ptr<duckdb::SelectionData,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
                 _M_pi);
    }
    if (local_98.validity.super_TemplatedValidityMask<unsigned_long>.validity_data.internal.
        super___shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_(__gnu_cxx::_Lock_policy)2>
        ._M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                (local_98.validity.super_TemplatedValidityMask<unsigned_long>.validity_data.internal
                 .
                 super___shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_(__gnu_cxx::_Lock_policy)2>
                 ._M_refcount._M_pi);
    }
  }
  return;
}

Assistant:

static void UnaryUpdate(Vector &input, AggregateInputData &aggr_input_data, data_ptr_t state, idx_t count) {
		switch (input.GetVectorType()) {
		case VectorType::CONSTANT_VECTOR: {
			if (OP::IgnoreNull() && ConstantVector::IsNull(input)) {
				return;
			}
			auto idata = ConstantVector::GetData<INPUT_TYPE>(input);
			AggregateUnaryInput input_data(aggr_input_data, ConstantVector::Validity(input));
			OP::template ConstantOperation<INPUT_TYPE, STATE_TYPE, OP>(*reinterpret_cast<STATE_TYPE *>(state), *idata,
			                                                           input_data, count);
			break;
		}
#ifndef DUCKDB_SMALLER_BINARY
		case VectorType::FLAT_VECTOR: {
			auto idata = FlatVector::GetData<INPUT_TYPE>(input);
			UnaryFlatUpdateLoop<STATE_TYPE, INPUT_TYPE, OP>(idata, aggr_input_data, (STATE_TYPE *)state, count,
			                                                FlatVector::Validity(input));
			break;
		}
#endif
		default: {
			UnifiedVectorFormat idata;
			input.ToUnifiedFormat(count, idata);
			UnaryUpdateLoop<STATE_TYPE, INPUT_TYPE, OP>(UnifiedVectorFormat::GetData<INPUT_TYPE>(idata),
			                                            aggr_input_data, (STATE_TYPE *)state, count, idata.validity,
			                                            *idata.sel);
			break;
		}
		}
	}